

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expansion.c
# Opt level: O2

void add_hook(dw_rom *rom,hooktype type,uint16_t address,subroutine to_addr)

{
  undefined8 in_RAX;
  
  if ((type != JMP) && (type != JSR)) {
    if (type == DIALOGUE) {
      vpatch(rom,address,4,0x20,(ulong)(to_addr & 0xff),(ulong)(to_addr >> 8),
             CONCAT44((int)((ulong)in_RAX >> 0x20),0xea));
      return;
    }
    return;
  }
  vpatch(rom,address,3,type,(ulong)(to_addr & 0xff),(ulong)(to_addr >> 8));
  return;
}

Assistant:

void add_hook(dw_rom *rom, enum hooktype type, uint16_t address,
        enum subroutine to_addr)
{
    switch(type) {
        case DIALOGUE:
            vpatch(rom, address, 4, 0x20, to_addr & 0xff, to_addr >> 8, 0xea);
            break;
        case JSR:
        case JMP:
            vpatch(rom, address, 3, type, to_addr & 0xff, to_addr >> 8);
            break;
        default:
            break;
    }
}